

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *db;
  Expr *pEVar3;
  u8 uVar4;
  Select *pSVar5;
  Expr *p;
  Select **ppSVar6;
  long lVar7;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 1) != 0) && (pSubst->iTable == (int)pExpr->iRightJoinTable)) {
    pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
  }
  if (pExpr->op == 0xa0) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_0016baf5:
    pEVar3 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar3;
    pEVar3 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar3;
    pSVar5 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x800) == 0) {
      if ((pSVar5 != (Select *)0x0) && (0 < *(int *)&pSVar5->pEList)) {
        ppSVar6 = (Select **)&pSVar5->op;
        lVar7 = 0;
        do {
          pEVar3 = substExpr(pSubst,(Expr *)*ppSVar6);
          *ppSVar6 = (Select *)pEVar3;
          lVar7 = lVar7 + 1;
          ppSVar6 = ppSVar6 + 4;
        } while (lVar7 < *(int *)&pSVar5->pEList);
      }
    }
    else {
      substSelect(pSubst,pSVar5,1);
    }
    return pExpr;
  }
  if ((pExpr->op != 0x98) || (pExpr->iTable != pSubst->iTable)) goto LAB_0016baf5;
  if ((long)pExpr->iColumn < 0) {
    pExpr->op = 'e';
    return pExpr;
  }
  pEVar3 = pSubst->pEList->a[pExpr->iColumn].pExpr;
  uVar2 = pEVar3->op;
  uVar4 = uVar2;
  if (uVar2 == 0x9d) {
    uVar4 = pEVar3->op2;
  }
  if (uVar4 == 'w') {
    pSVar5 = (pEVar3->x).pSelect;
  }
  else {
    if (uVar4 != 0x9e) goto LAB_0016bb88;
    pSVar5 = (Select *)&pEVar3->x;
  }
  if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar5->pEList)->pList->nExpr) {
    sqlite3VectorErrorMsg(pSubst->pParse,pEVar3);
    return pExpr;
  }
LAB_0016bb88:
  db = pSubst->pParse->db;
  p = pEVar3;
  if ((uVar2 != 0x98) && (pSubst->isLeftJoin != 0)) {
    local_78.u.zToken = (char *)0x0;
    local_78.pRight = (Expr *)0x0;
    local_78.iColumn = 0;
    local_78.iAgg = 0;
    local_78.iRightJoinTable = 0;
    local_78.op2 = '\0';
    local_78._55_1_ = 0;
    local_78.pAggInfo = (AggInfo *)0x0;
    local_78.x.pList = (ExprList *)0x0;
    local_78.pTab = (Table *)0x0;
    local_78.op = 0xa0;
    local_78.affinity = '\0';
    local_78._2_2_ = 0;
    local_78.flags = 0;
    local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
    p = &local_78;
    local_78.pLeft = pEVar3;
  }
  pEVar3 = exprDup(db,p,0,(u8 **)0x0);
  if (pEVar3 != (Expr *)0x0) {
    if (pSubst->isLeftJoin != 0) {
      pbVar1 = (byte *)((long)&pEVar3->flags + 2);
      *pbVar1 = *pbVar1 | 0x10;
    }
    if ((pExpr->flags & 1) != 0) {
      pEVar3->iRightJoinTable = pExpr->iRightJoinTable;
      *(byte *)&pEVar3->flags = (byte)pEVar3->flags | 1;
    }
  }
  sqlite3ExprDeleteNN(db,pExpr);
  return pEVar3;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) && pExpr->iRightJoinTable==pSubst->iTable ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pLeft==0 && pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}